

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

String * __thiscall LiteScript::String::operator*=(String *this,uint nb)

{
  bool bVar1;
  u32string string;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> bStack_38;
  
  std::__cxx11::u32string::u32string((u32string *)&bStack_38,&this->str);
  (this->str)._M_string_length = 0;
  *(this->str)._M_dataplus._M_p = L'\0';
  while (bVar1 = nb != 0, nb = nb - 1, bVar1) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&this->str,&bStack_38);
  }
  std::__cxx11::u32string::~u32string((u32string *)&bStack_38);
  return this;
}

Assistant:

LiteScript::String& LiteScript::String::operator*=(unsigned int nb) {
    std::u32string string = this->str;
    this->str.clear();
    for (unsigned int i = 0; i < nb; i++)
        this->str += string;
    return *this;
}